

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::getGlobalElemDecl(TraverseSchema *this,DOMElement *elem,XMLCh *qName)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  short *psVar1;
  XMLStringPool *pXVar2;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar3;
  ulong uVar4;
  SchemaInfo *pSVar5;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  XMLCh *text2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMElement *elem_00;
  SchemaElementDecl *pSVar11;
  Grammar *pGVar12;
  SchemaElementDecl *pSVar13;
  SchemaInfo *toRestore_00;
  XMLCh *pXVar14;
  XMLSize_t XVar15;
  XMLSize_t getAt;
  ulong uVar16;
  ulong uVar17;
  ListType aListType;
  bool bVar18;
  undefined4 extraout_var_02;
  
  iVar8 = XMLString::indexOf(qName,L':');
  if (iVar8 + 1U < 2) {
    pXVar14 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,qName,(long)iVar8);
    pXVar2 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar9 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2);
    iVar8 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar9);
    pXVar14 = (XMLCh *)CONCAT44(extraout_var,iVar8);
  }
  pXVar14 = resolvePrefixToURI(this,elem,pXVar14);
  iVar8 = XMLString::indexOf(qName,L':');
  XVar15 = 0;
  if (qName != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)qName + XVar15);
      XVar15 = XVar15 + 2;
    } while (*psVar1 != 0);
    XVar15 = ((long)XVar15 >> 1) - 1;
  }
  if (XVar15 == (long)(iVar8 + 1)) {
    text2 = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar8 == -1) {
      this_00->fIndex = 0;
    }
    else {
      qName = qName + (long)iVar8 + 1;
      XVar15 = XVar15 + ~(long)iVar8;
      this_00->fIndex = 0;
    }
    XMLBuffer::append(this_00,qName,XVar15);
    pXVar2 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar9 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2);
    iVar8 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar9);
    text2 = (XMLCh *)CONCAT44(extraout_var_00,iVar8);
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  uVar9 = this->fCurrentScope;
  uVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
  if (this->fSchemaInfo->fTargetNSURI == uVar10) {
    iVar8 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (this->fSchemaGrammar,(ulong)(uint)this->fTargetNSURI,text2,0,0xfffffffe);
    pSVar11 = (SchemaElementDecl *)CONCAT44(extraout_var_01,iVar8);
    aListType = INCLUDE;
    goto LAB_0033c173;
  }
  pVVar3 = this->fImportedNSList;
  if (pVVar3 == (ValueVectorOf<int> *)0x0) goto LAB_0033c2ac;
  uVar4 = pVVar3->fCurCount;
  bVar18 = uVar4 != 0;
  if (uVar4 == 0) {
LAB_0033c24c:
    if (!bVar18) {
LAB_0033c2ac:
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,pXVar14,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      return (SchemaElementDecl *)0x0;
    }
  }
  else if (*pVVar3->fElemList != uVar10) {
    uVar16 = 0;
    do {
      uVar17 = uVar4;
      if (uVar4 - 1 == uVar16) break;
      uVar17 = uVar16 + 1;
      lVar7 = uVar16 + 1;
      uVar16 = uVar17;
    } while (pVVar3->fElemList[lVar7] != uVar10);
    bVar18 = uVar17 < uVar4;
    goto LAB_0033c24c;
  }
  pGVar12 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar14);
  if ((pGVar12 == (Grammar *)0x0) ||
     (iVar8 = (*(pGVar12->super_XSerializable)._vptr_XSerializable[5])(pGVar12), iVar8 != 1)) {
    bVar18 = false;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x26,pXVar14,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    aListType = INCLUDE;
    pSVar11 = (SchemaElementDecl *)0x0;
  }
  else {
    iVar8 = (*(pGVar12->super_XSerializable)._vptr_XSerializable[0xb])
                      (pGVar12,(ulong)uVar10,text2,0,0xfffffffe);
    pSVar13 = (SchemaElementDecl *)CONCAT44(extraout_var_02,iVar8);
    if (pSVar13 == (SchemaElementDecl *)0x0) {
      pSVar5 = *enclosingSchema;
      pRVar6 = pSVar5->fImportedInfoList;
      if (pRVar6 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
        XVar15 = 0;
      }
      else {
        XVar15 = (pRVar6->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
      }
      if (XVar15 != 0) {
        getAt = 0;
        do {
          toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                   (&pSVar5->fImportedInfoList->
                                     super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
          if (toRestore_00->fTargetNSURI == uVar10) goto LAB_0033c36d;
          getAt = getAt + 1;
        } while (XVar15 != getAt);
      }
      toRestore_00 = (SchemaInfo *)0x0;
LAB_0033c36d:
      if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true)) {
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,pXVar14,text2,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        aListType = INCLUDE;
        bVar18 = false;
      }
      else {
        aListType = IMPORT;
        restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
        bVar18 = true;
      }
      pSVar11 = (SchemaElementDecl *)0x0;
      if (bVar18) {
        pSVar11 = pSVar13;
      }
    }
    else {
      aListType = INCLUDE;
      bVar18 = true;
      pSVar11 = pSVar13;
    }
  }
  if (!bVar18) {
    return (SchemaElementDecl *)0x0;
  }
LAB_0033c173:
  if (pSVar11 == (SchemaElementDecl *)0x0) {
    elem_00 = SchemaInfo::getTopLevelComponent(*enclosingSchema,5,L"element",text2,enclosingSchema);
    if (elem_00 == (DOMElement *)0x0) {
      pSVar11 = (SchemaElementDecl *)0x0;
    }
    else {
      pSVar11 = traverseElementDecl(this,elem_00,true);
    }
    if (pSVar11 == (SchemaElementDecl *)0x0) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,pXVar14,text2,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  if (toRestore != *enclosingSchema) {
    restoreSchemaInfo(this,toRestore,aListType,uVar9);
  }
  return pSVar11;
}

Assistant:

SchemaElementDecl*
TraverseSchema::getGlobalElemDecl(const DOMElement* const elem,
                                  const XMLCh* const qName)
{
    const XMLCh*         nameURI =  resolvePrefixToURI(elem, getPrefix(qName));
    const XMLCh*         localPart = getLocalPart(qName);
    SchemaElementDecl*   elemDecl = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;
    unsigned int         uriId = fURIStringPool->addOrFind(nameURI);

    if (fSchemaInfo->getTargetNSURI() != (int) uriId)
    {
    //if (!XMLString::equals(nameURI, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        if (!isImportingNS(uriId))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, nameURI);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(nameURI);

        if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType)
        {
            elemDecl = (SchemaElementDecl*) grammar->getElemDecl(
                uriId, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
        }
        else
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, nameURI);
            return 0;
        }

        if (!elemDecl)
        {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);
            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else
    {
        elemDecl = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(fTargetNSURI, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
    }

    if (!elemDecl)
    {
        DOMElement* subsGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Element,
            SchemaSymbols::fgELT_ELEMENT,localPart, &fSchemaInfo);

        if (subsGroupElem)
            elemDecl = traverseElementDecl(subsGroupElem, true);

        if (!elemDecl)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    return elemDecl;
}